

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O0

void __thiscall Kernel::Clause::Clause(Clause *this,Literal **lits,uint length,Inference *inf)

{
  Literal *pLVar1;
  UnitInputType UVar2;
  Inference *pIVar3;
  Literal **ppLVar4;
  undefined8 *in_RCX;
  uint in_EDX;
  long in_RSI;
  Clause *in_RDI;
  uint i;
  Inference *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  uint local_68;
  Inference local_58;
  uint local_14;
  long local_10;
  
  local_58._0_8_ = *in_RCX;
  local_58._8_8_ = in_RCX[1];
  local_58._splits = (SplitSet *)in_RCX[2];
  local_58._ptr1 = (void *)in_RCX[3];
  local_58._ptr2 = (void *)in_RCX[4];
  local_58._40_8_ = in_RCX[5];
  local_14 = in_EDX;
  local_10 = in_RSI;
  Unit::Unit((Unit *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
             (Kind)((ulong)in_stack_ffffffffffffff78 >> 0x20),in_stack_ffffffffffffff70);
  Inference::~Inference(&local_58);
  *(ulong *)&in_RDI->field_0x38 =
       *(ulong *)&in_RDI->field_0x38 & 0xfffffffffff00000 | (ulong)(local_14 & 0xfffff);
  in_RDI->field_0x3a = in_RDI->field_0x3a | 0x30;
  in_RDI->field_0x3a = in_RDI->field_0x3a & 0xbf;
  in_RDI->field_0x3a = in_RDI->field_0x3a & 0x7f;
  in_RDI->field_0x3b = in_RDI->field_0x3b & 0xfe;
  *(ulong *)&in_RDI->field_0x38 = *(ulong *)&in_RDI->field_0x38 & 0xfffffffff1ffffff | 0x6000000;
  *(uint *)&in_RDI->field_0x3c = *(uint *)&in_RDI->field_0x3c & 0xfff00000;
  in_RDI->_weight = 0;
  in_RDI->_weightForClauseSelection = 0;
  in_RDI->_refCnt = 0;
  in_RDI->_reductionTimestamp = 0;
  in_RDI->_literalPositions = (InverseLookup<Kernel::Literal> *)0x0;
  in_RDI->_numActiveSplits = 0;
  in_RDI->_auxTimestamp = 0;
  pIVar3 = Unit::inference(&in_RDI->super_Unit);
  UVar2 = Inference::inputType(pIVar3);
  if (UVar2 == EXTENSIONALITY_AXIOM) {
    in_RDI->field_0x3a = in_RDI->field_0x3a | 0x80;
    pIVar3 = Unit::inference(&in_RDI->super_Unit);
    Inference::setInputType(pIVar3,AXIOM);
  }
  for (local_68 = 0; local_68 < local_14; local_68 = local_68 + 1) {
    pLVar1 = *(Literal **)(local_10 + (ulong)local_68 * 8);
    ppLVar4 = operator[](in_RDI,local_68);
    *ppLVar4 = pLVar1;
  }
  Unit::doUnitTracing(&in_RDI->super_Unit);
  return;
}

Assistant:

Clause::Clause(Literal* const* lits, unsigned length, Inference inf)
  : Unit(Unit::CLAUSE, std::move(inf)),
    _length(length),
    _color(COLOR_INVALID),
    _extensionality(false),
    _extensionalityTag(false),
    _component(false),
    _store(NONE),
    _numSelected(0),
    _weight(0),
    _weightForClauseSelection(0),
    _refCnt(0),
    _reductionTimestamp(0),
    _literalPositions(0),
    _numActiveSplits(0),
    _auxTimestamp(0)
{
  // MS: TODO: not sure if this belongs here and whether EXTENSIONALITY_AXIOM input types ever appear anywhere (as a vampire-extension TPTP formula role)
  if(inference().inputType() == UnitInputType::EXTENSIONALITY_AXIOM){
    //cout << "Setting extensionality" << endl;
    _extensionalityTag = true;
    inference().setInputType(UnitInputType::AXIOM);
  }

  for(unsigned i = 0; i < length; i++) {
    (*this)[i] = lits[i];
  }

  doUnitTracing();
}